

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O1

void __thiscall tst_qpromise_timeout::timeout(tst_qpromise_timeout *this)

{
  QSharedData *pQVar1;
  anon_class_24_3_494f60a1 callback;
  int *piVar2;
  long *plVar3;
  _func_int **pp_Var4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar5;
  PromiseResolver<int> PVar6;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  long *plVar11;
  QSlotObjectBase *pQVar12;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<int> *pPVar13;
  char *pcVar14;
  char *pcVar15;
  QPromiseReject<int> *in_R8;
  QSharedData *pQVar16;
  bool failed;
  _func_int **local_178;
  PromiseResolver<int> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_160;
  function<void_(const_int_&)> local_158;
  PromiseResolver<int> resolver;
  QPromiseBase<int> local_118;
  QPromise<int> p;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  QSharedData *local_d8;
  long *local_d0;
  long *local_c8;
  qint64 elapsed;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _func_int **local_78;
  _func_int **local_70;
  undefined **local_68;
  QElapsedTimer timer;
  _Any_data local_50;
  code *local_40;
  
  timer.t1 = -0x8000000000000000;
  timer.t2 = -0x8000000000000000;
  elapsed = -1;
  failed = false;
  QElapsedTimer::start();
  plVar11 = (long *)operator_new(0x68);
  *plVar11 = 0;
  plVar11[1] = 0;
  plVar11[2] = 0;
  plVar11[3] = 0;
  plVar11[4] = 0;
  plVar11[5] = 0;
  plVar11[6] = 0;
  plVar11[7] = 0;
  plVar11[8] = 0;
  plVar11[9] = 0;
  plVar11[10] = 0;
  plVar11[0xb] = 0;
  plVar11[0xc] = 0;
  local_70 = (_func_int **)&PTR__PromiseDataBase_0011fb48;
  *plVar11 = (long)&PTR__PromiseDataBase_0011fb48;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(plVar11 + 2),0);
  *(undefined1 *)(plVar11 + 3) = 0;
  plVar11[4] = 0;
  plVar11[5] = 0;
  plVar11[6] = 0;
  plVar11[7] = 0;
  plVar11[8] = 0;
  plVar11[9] = 0;
  plVar11[10] = 0;
  local_78 = (_func_int **)&PTR__PromiseData_0011fad0;
  *plVar11 = (long)&PTR__PromiseData_0011fad0;
  plVar11[0xb] = 0;
  plVar11[0xc] = 0;
  LOCK();
  *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
  UNLOCK();
  LOCK();
  *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
  UNLOCK();
  local_c8 = plVar11 + 1;
  local_158.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fa98;
  local_158.super__Function_base._M_functor._8_8_ = plVar11;
  local_d0 = plVar11;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_158);
  local_158.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fa68;
  if ((long *)local_158.super__Function_base._M_functor._8_8_ != (long *)0x0) {
    LOCK();
    plVar11 = (long *)(local_158.super__Function_base._M_functor._8_8_ + 8);
    *(int *)plVar11 = *(int *)plVar11 + -1;
    UNLOCK();
    if ((*(int *)plVar11 == 0) &&
       ((long *)local_158.super__Function_base._M_functor._8_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_158.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar6.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  pQVar12 = (QSlotObjectBase *)operator_new(0x18);
  if (PVar6.m_d.d == (Data *)0x0) {
    (pQVar12->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar12->m_impl =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:84:43),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(undefined8 *)(pQVar12 + 1) = 0;
  }
  else {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
    (pQVar12->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar12->m_impl =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:84:43),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)(pQVar12 + 1) =
         PVar6.m_d.d;
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
  }
  QTimer::singleShotImpl(4000,CoarseTimer,(QObject *)0x0,pQVar12);
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  plVar11 = local_d0;
  local_158.super__Function_base._M_functor._8_8_ = &local_68;
  local_68 = &PTR__QException_0011fa18;
  local_158.super__Function_base._M_functor._M_unused._M_object = &local_f8;
  local_f8._0_4_ = 2000;
  LOCK();
  *(int *)(local_d0 + 1) = (int)local_d0[1] + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011fa98;
  callback.error = (QPromiseTimeoutException *)local_158.super__Function_base._M_functor._8_8_;
  callback.msec = (int *)local_158.super__Function_base._M_functor._M_unused._0_8_;
  callback.p = (QPromise<int> *)&resolver;
  local_158.super__Function_base._M_manager = (_Manager_type)&resolver;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:122:24),_0>
            (&local_118,callback);
  local_118._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa98;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011fa68;
  if (plVar11 != (long *)0x0) {
    LOCK();
    plVar3 = plVar11 + 1;
    *(int *)plVar3 = (int)*plVar3 + -1;
    UNLOCK();
    if (((int)*plVar3 == 0) && (plVar11 != (long *)0x0)) {
      (**(code **)(*plVar11 + 8))();
    }
  }
  QVar7.d = local_118.m_d.d;
  if (local_118.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_118.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011fcf0;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011fc88;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_d8 = &this_00->super_QSharedData;
  local_158.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fc20;
  local_158.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&resolver,(QPromise<void> *)&local_158);
  local_158.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fc68;
  if ((PromiseDataBase<void,_void_()> *)local_158.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_158.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_158.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_158.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar6.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x20);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_98._M_unused._0_8_)->d = (Data *)PVar6.m_d.d;
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_98._M_unused._0_8_ + 8))->d = (Data *)PVar6.m_d.d;
  if (PVar6.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_98._M_unused._0_8_ + 0x10))->d = (Data *)&elapsed;
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_98._M_unused._0_8_ + 0x18))->d = (Data *)&timer;
    pcStack_80 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_98._M_unused._0_8_ + 0x10))->d = (Data *)&elapsed;
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_98._M_unused._0_8_ + 0x18))->d = (Data *)&timer;
    pcStack_80 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
  }
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x20);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_b8._M_unused._0_8_)->d = (Data *)PVar6.m_d.d;
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_b8._M_unused._0_8_ + 8))->d = (Data *)PVar6.m_d.d;
  if (PVar6.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_b8._M_unused._0_8_ + 0x10))->d = (Data *)&elapsed;
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_b8._M_unused._0_8_ + 0x18))->d = (Data *)&timer;
    pcStack_a0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_b8._M_unused._0_8_ + 0x10))->d = (Data *)&elapsed;
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_b8._M_unused._0_8_ + 0x18))->d = (Data *)&timer;
    pcStack_a0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  pQVar1 = &((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar16 = &((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa68;
  pPVar13 = (PromiseData<int> *)operator_new(0x68);
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_70;
  QReadWriteLock::QReadWriteLock
            (&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_78;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar16 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar13 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar16 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011fa98;
  p.super_QPromiseBase<int>.m_d.d = pPVar13;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,(QPromise<int> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011fa68;
  if (pPVar13 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar16 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (pPVar13 != (PromiseData<int> *)0x0)) {
      (*(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  local_178 = (_func_int **)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_);
  if (local_178 != (_func_int **)0x0) {
    LOCK();
    *(int *)local_178 = *(int *)local_178 + 1;
    UNLOCK();
  }
  local_160.d = (Data *)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_);
  if (local_160.d != (Data *)0x0) {
    LOCK();
    ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_178 != (_func_int **)0x0) {
    LOCK();
    *(int *)local_178 = *(int *)local_178 + 1;
    UNLOCK();
  }
  if (local_160.d != (Data *)0x0) {
    LOCK();
    ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_158._M_invoker = (_Invoker_type)QVar7.d;
  LOCK();
  pQVar16 = &((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_158.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_0011fa98;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_158.super__Function_base._M_functor._M_unused._0_8_ = local_178;
  local_158.super__Function_base._M_functor._8_8_ = local_160.d;
  local_f8._M_unused._M_object = operator_new(0x20);
  *(void **)local_f8._M_unused._0_8_ = local_158.super__Function_base._M_functor._M_unused._M_object
  ;
  if ((int *)local_158.super__Function_base._M_functor._M_unused._0_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_158.super__Function_base._M_functor._M_unused._0_8_ =
         *local_158.super__Function_base._M_functor._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_f8._M_unused._0_8_ + 8) =
       local_158.super__Function_base._M_functor._8_8_;
  if ((int *)local_158.super__Function_base._M_functor._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_158.super__Function_base._M_functor._8_8_ =
         *(int *)local_158.super__Function_base._M_functor._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_f8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_0011fa68;
  *(_Invoker_type *)((long)local_f8._M_unused._0_8_ + 0x18) = local_158._M_invoker;
  if ((PromiseData<int> *)local_158._M_invoker != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar16 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_158._M_invoker)->super_QSharedData
    ;
    (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_f8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_0011fa98;
  pcStack_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
             ::_M_manager;
  local_158.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_0011fa68;
  if ((PromiseData<int> *)local_158._M_invoker != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar16 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_158._M_invoker)->super_QSharedData
    ;
    (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_158._M_invoker != (PromiseData<int> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_158._M_invoker)->_vptr_PromiseDataBase[1]
      )();
    }
  }
  if ((int *)local_158.super__Function_base._M_functor._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_158.super__Function_base._M_functor._8_8_ =
         *(int *)local_158.super__Function_base._M_functor._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_158.super__Function_base._M_functor._8_8_ == 0) &&
       ((int *)local_158.super__Function_base._M_functor._8_8_ != (int *)0x0)) {
      operator_delete((void *)local_158.super__Function_base._M_functor._8_8_,0x10);
    }
  }
  if ((int *)local_158.super__Function_base._M_functor._M_unused._0_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_158.super__Function_base._M_functor._M_unused._0_8_ =
         *local_158.super__Function_base._M_functor._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_158.super__Function_base._M_functor._M_unused._M_object == 0) &&
       ((int *)local_158.super__Function_base._M_functor._M_unused._0_8_ != (int *)0x0)) {
      operator_delete(local_158.super__Function_base._M_functor._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_00,(function<void_()> *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_178,
             (QPromiseResolve<int> *)&local_160,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_160.d != (Data *)0x0) {
    LOCK();
    ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_160.d != (Data *)0x0)) {
      operator_delete(local_160.d,0x10);
    }
  }
  if (local_178 != (_func_int **)0x0) {
    LOCK();
    *(int *)local_178 = *(int *)local_178 + -1;
    UNLOCK();
    if ((*(int *)local_178 == 0) && (local_178 != (_func_int **)0x0)) {
      operator_delete(local_178,0x10);
    }
  }
  piVar2 = (int *)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) &&
       ((void *)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_) != (void *)0x0)) {
      operator_delete((void *)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_),0x10);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa98;
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar7.d)
    ;
  }
  LOCK();
  (local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar7.d)
    ;
  }
  plVar11 = local_c8;
  local_118._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa68;
  if (local_118.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_118.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_118.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_118.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1]
      )();
    }
  }
  QException::~QException((QException *)&local_68);
  LOCK();
  *(int *)plVar11 = (int)*plVar11 + -1;
  UNLOCK();
  if ((int)*plVar11 == 0) {
    (**(code **)(*local_d0 + 8))();
  }
  pPVar13 = (PromiseData<int> *)operator_new(0x68);
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_70;
  QReadWriteLock::QReadWriteLock
            (&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_78;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar16 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar1 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_118._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa98;
  local_118.m_d.d = pPVar13;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,(QPromise<int> *)&local_118);
  local_118._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa68;
  if (local_118.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_118.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_118.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_118.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1]
      )();
    }
  }
  QVar7.d = p.super_QPromiseBase<int>.m_d.d;
  local_178 = (_func_int **)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_);
  if (local_178 != (_func_int **)0x0) {
    LOCK();
    *(int *)local_178 = *(int *)local_178 + 1;
    UNLOCK();
  }
  local_160.d = (Data *)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_);
  if (local_160.d != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<int> *)&(local_160.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<int> *)&(local_160.d)->super_QSharedData)->_vptr_QPromiseBase + 1;
    UNLOCK();
  }
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_158,(PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_178,
             (QPromiseResolve<int> *)&local_160,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_158);
  if ((undefined **)local_158.super__Function_base._M_manager != (undefined **)0x0) {
    (*local_158.super__Function_base._M_manager)
              ((_Any_data *)&local_158,(_Any_data *)&local_158,__destroy_functor);
  }
  QVar5.d = local_160.d;
  pp_Var4 = local_178;
  if (local_178 != (_func_int **)0x0) {
    LOCK();
    *(int *)local_178 = *(int *)local_178 + 1;
    UNLOCK();
  }
  if (local_160.d != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<int> *)&(local_160.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<int> *)&(local_160.d)->super_QSharedData)->_vptr_QPromiseBase + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x18);
  *(_func_int ***)resolver.m_d.d = pp_Var4;
  if (pp_Var4 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var4 = *(int *)pp_Var4 + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)QVar5.d;
  if (QVar5.d == (Data *)0x0) {
    *(bool **)((long)resolver.m_d.d + 0x10) = &failed;
  }
  else {
    LOCK();
    *(int *)&((QPromiseBase<int> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<int> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase + 1;
    UNLOCK();
    *(bool **)((long)resolver.m_d.d + 0x10) = &failed;
    LOCK();
    *(int *)&((QPromiseBase<int> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<int> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)&((QPromiseBase<int> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase == 0) {
      operator_delete(QVar5.d,0x10);
    }
  }
  if (pp_Var4 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
    UNLOCK();
    if (*(int *)pp_Var4 == 0) {
      operator_delete(pp_Var4,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::
  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  if (local_160.d != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<int> *)&(local_160.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<int> *)&(local_160.d)->super_QSharedData)->_vptr_QPromiseBase + -1;
    UNLOCK();
    if ((*(int *)&((QPromiseBase<int> *)&(local_160.d)->super_QSharedData)->_vptr_QPromiseBase == 0)
       && (local_160.d != (Data *)0x0)) {
      operator_delete(local_160.d,0x10);
    }
  }
  if (local_178 != (_func_int **)0x0) {
    LOCK();
    *(int *)local_178 = *(int *)local_178 + -1;
    UNLOCK();
    if ((*(int *)local_178 == 0) && (local_178 != (_func_int **)0x0)) {
      operator_delete(local_178,0x10);
    }
  }
  piVar2 = (int *)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) &&
       ((void *)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_) != (void *)0x0)) {
      operator_delete((void *)CONCAT71(resolver_2.m_d.d._1_7_,resolver_2.m_d.d._0_1_),0x10);
    }
  }
  QVar7.d = p.super_QPromiseBase<int>.m_d.d;
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar13);
  while (bVar8 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar13);
  }
  LOCK();
  (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(pPVar13);
  }
  LOCK();
  (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(pPVar13);
  }
  local_118._vptr_QPromiseBase =
       (_func_int **)CONCAT44(local_118._vptr_QPromiseBase._4_4_,0xffffffff);
  iVar10 = waitForValue<int>(&p,(int *)&local_118);
  cVar9 = QTest::qCompare(iVar10,-1,"waitForValue(p, -1)","-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                          ,0x61);
  QVar7 = p.super_QPromiseBase<int>.m_d;
  if (cVar9 != '\0') {
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar8 = (bool)(~bVar8 & ((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object != (void *)0x0);
    local_118._vptr_QPromiseBase = (_func_int **)CONCAT71(local_118._vptr_QPromiseBase._1_7_,bVar8);
    resolver_2.m_d.d._0_1_ = 1;
    pcVar14 = QTest::toString<bool>((bool *)&local_118);
    pcVar15 = QTest::toString<bool>((bool *)&resolver_2);
    cVar9 = QTest::compare_helper
                      (bVar8,"Compared values are not the same",pcVar14,pcVar15,"p.isRejected()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x62);
    bVar8 = failed;
    if (cVar9 != '\0') {
      local_118._vptr_QPromiseBase = (_func_int **)CONCAT71(local_118._vptr_QPromiseBase._1_7_,1);
      pcVar14 = QTest::toString<bool>(&failed);
      pcVar15 = QTest::toString<bool>((bool *)&local_118);
      cVar9 = QTest::compare_helper
                        (bVar8,"Compared values are not the same",pcVar14,pcVar15,"failed","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                         ,99);
      if ((cVar9 != '\0') &&
         (cVar9 = QTest::qVerify(0x757 < elapsed,"elapsed >= static_cast<qint64>(2000 * 0.94)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                                 ,0x68), cVar9 != '\0')) {
        QTest::qVerify(elapsed < 0x849,"elapsed <= static_cast<qint64>(2000 * 1.06)","",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x69);
      }
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa68;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_timeout::timeout()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;
    bool failed = false;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
                 QTimer::singleShot(4000, [=]() {
                     resolve(42);
                 });
             }}.timeout(2000)
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    p.fail([&](const QtPromise::QPromiseTimeoutException&) {
         failed = true;
         return -1;
     }).wait();

    QCOMPARE(waitForValue(p, -1), -1);
    QCOMPARE(p.isRejected(), true);
    QCOMPARE(failed, true);

    // Qt::CoarseTimer (default) Coarse timers try to
    // keep accuracy within 5% of the desired interval.
    // Require accuracy within 6% for passing the test.
    QVERIFY(elapsed >= static_cast<qint64>(2000 * 0.94));
    QVERIFY(elapsed <= static_cast<qint64>(2000 * 1.06));
}